

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  undefined1 auVar11 [16];
  
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    rStatus->data[iVar2] = rStatus->data[iVar1];
  }
  iVar1 = this->m_j;
  iVar2 = this->m_old_j;
  if (iVar1 != iVar2) {
    pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    pdVar3 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    cStatus->data[iVar2] = cStatus->data[iVar1];
  }
  dVar8 = SVectorBase<double>::operator[](&(this->m_row).super_SVectorBase<double>,iVar1);
  lVar6 = (long)(this->m_row).super_SVectorBase<double>.memused;
  if (lVar6 < 1) {
    dVar9 = 0.0;
  }
  else {
    pNVar4 = (this->m_row).super_SVectorBase<double>.m_elem;
    dVar9 = 0.0;
    lVar7 = 0;
    do {
      iVar1 = *(int *)((long)&pNVar4->idx + lVar7);
      if (iVar1 != this->m_j) {
        dVar9 = dVar9 + *(double *)((long)&pNVar4->val + lVar7) *
                        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar1];
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar6 * 0x10 != lVar7);
  }
  dVar10 = ABS(this->m_lRhs);
  auVar11._8_8_ = dVar9;
  auVar11._0_8_ = this->m_lRhs;
  if (dVar10 <= ABS(dVar9)) {
    dVar10 = ABS(dVar9);
  }
  dVar9 = 1.0;
  if (1.0 <= dVar10) {
    dVar9 = dVar10;
  }
  auVar5._8_8_ = dVar9;
  auVar5._0_8_ = dVar9;
  auVar11 = divpd(auVar11,auVar5);
  dVar10 = auVar11._0_8_ - auVar11._8_8_;
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  iVar1 = this->m_j;
  (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] =
       ((double)(~-(ulong)(ABS(dVar10) <= extraout_XMM0_Qa) & (ulong)dVar10) * dVar9) / dVar8;
  iVar2 = this->m_i;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = this->m_lRhs;
  (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = this->m_obj / dVar8;
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] = 0.0;
  cStatus->data[iVar1] = BASIC;
  if (this->m_eqCons == false) {
    if (this->m_onLhs == true) {
      rStatus->data[iVar2] = ON_LOWER;
    }
    else {
      rStatus->data[iVar2] = ON_UPPER;
    }
  }
  else {
    rStatus->data[iVar2] = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}